

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O3

SimpleString __thiscall JUnitTestOutput::encodeXmlText(JUnitTestOutput *this,SimpleString *textbody)

{
  char *otherBuffer;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  SimpleString SVar1;
  
  otherBuffer = SimpleString::asCharString(in_RDX);
  SimpleString::SimpleString((SimpleString *)this,otherBuffer);
  SimpleString::replace((SimpleString *)this,"&","&amp;");
  SimpleString::replace((SimpleString *)this,"\"","&quot;");
  SimpleString::replace((SimpleString *)this,"<","&lt;");
  SimpleString::replace((SimpleString *)this,">","&gt;");
  SimpleString::replace((SimpleString *)this,"\n","{newline}");
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)this;
  return SVar1;
}

Assistant:

SimpleString JUnitTestOutput::encodeXmlText(const SimpleString& textbody)
{
    SimpleString buf = textbody.asCharString();
    buf.replace("&", "&amp;");
    buf.replace("\"", "&quot;");
    buf.replace("<", "&lt;");
    buf.replace(">", "&gt;");
    buf.replace("\n", "{newline}");
    return buf;
}